

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O3

void Gia_ManDumpVerilog(Gia_Man_t *p,char *pFileName,Vec_Int_t *vObjs)

{
  Gia_Obj_t *pGVar1;
  bool bVar2;
  uint uVar3;
  FILE *__s;
  Vec_Bit_t *vObjs_00;
  Vec_Bit_t *vObjs_01;
  size_t sVar4;
  ushort **ppuVar5;
  Vec_Int_t *pVVar6;
  Gia_Obj_t *pGVar7;
  uint uVar8;
  int iVar9;
  char *pcVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  
  uVar11 = p->nObjs;
  if (1 < uVar11) {
    uVar3 = uVar11 - 1;
    uVar11 = 0;
    do {
      uVar11 = uVar11 + 1;
      bVar2 = 9 < uVar3;
      uVar3 = uVar3 / 10;
    } while (bVar2);
  }
  uVar3 = p->vCis->nSize - p->nRegs;
  if (1 < uVar3) {
    uVar8 = uVar3 - 1;
    uVar3 = 0;
    do {
      uVar3 = uVar3 + 1;
      bVar2 = 9 < uVar8;
      uVar8 = uVar8 / 10;
    } while (bVar2);
  }
  if (p->nRegs != 0) {
    puts("Currently cannot write sequential AIG.");
    return;
  }
  __s = fopen(pFileName,"wb");
  if (__s == (FILE *)0x0) {
    printf("Cannot open output file \"%s\".\n",pFileName);
    return;
  }
  vObjs_00 = Gia_ManGenUsed(p,0);
  vObjs_01 = Gia_ManGenUsed(p,1);
  fwrite("module ",7,1,__s);
  pcVar10 = p->pName;
  sVar4 = strlen(pcVar10);
  if (0 < (int)sVar4) {
    lVar13 = 0;
    ppuVar5 = __ctype_b_loc();
    do {
      iVar9 = (int)pcVar10[lVar13];
      if (((*ppuVar5)[iVar9] & 0xc00) == 0) {
        iVar9 = 0x5f;
      }
      fputc(iVar9,__s);
      lVar13 = lVar13 + 1;
      pcVar10 = p->pName;
      sVar4 = strlen(pcVar10);
    } while (lVar13 < (int)sVar4);
  }
  fwrite(" (\n    ",7,1,__s);
  Gia_ManWriteNames((FILE *)__s,'x',p->vCis->nSize - p->nRegs,p->vNamesIn,4,4,(Vec_Bit_t *)0x0);
  fwrite(",\n    ",6,1,__s);
  Gia_ManWriteNames((FILE *)__s,'z',p->vCos->nSize - p->nRegs,p->vNamesOut,4,4,(Vec_Bit_t *)0x0);
  fwrite("\n  );\n\n",7,1,__s);
  fwrite("  input ",8,1,__s);
  Gia_ManWriteNames((FILE *)__s,'x',p->vCis->nSize - p->nRegs,p->vNamesIn,8,4,(Vec_Bit_t *)0x0);
  fwrite(";\n\n",3,1,__s);
  fwrite("  output ",9,1,__s);
  Gia_ManWriteNames((FILE *)__s,'z',p->vCos->nSize - p->nRegs,p->vNamesOut,9,4,(Vec_Bit_t *)0x0);
  fwrite(";\n\n",3,1,__s);
  iVar9 = Vec_BitCount((Vec_Bit_t *)(ulong)(uint)vObjs_01->nSize);
  if (iVar9 != 0) {
    fwrite("  wire ",7,1,__s);
    Gia_ManWriteNames((FILE *)__s,'n',p->nObjs,(Vec_Ptr_t *)0x0,7,4,vObjs_01);
    fwrite(";\n\n",3,1,__s);
  }
  iVar9 = Vec_BitCount((Vec_Bit_t *)(ulong)(uint)vObjs_00->nSize);
  if (iVar9 != 0) {
    fwrite("  wire ",7,1,__s);
    Gia_ManWriteNames((FILE *)__s,'i',p->nObjs,(Vec_Ptr_t *)0x0,7,4,vObjs_00);
    fwrite(";\n\n",3,1,__s);
  }
  if (vObjs != (Vec_Int_t *)0x0) {
    fwrite("  wire ",7,1,__s);
    iVar9 = vObjs->nSize;
    if (0 < iVar9) {
      uVar14 = 0;
      do {
        pcVar10 = "";
        if ((int)uVar14 != iVar9 + -1) {
          pcVar10 = ",";
        }
        fprintf(__s," t_%d%s",uVar14,pcVar10);
        uVar8 = (int)uVar14 + 1;
        uVar14 = (ulong)uVar8;
        iVar9 = vObjs->nSize;
      } while ((int)uVar8 < iVar9);
    }
    fwrite(";\n\n",3,1,__s);
    if (0 < vObjs->nSize) {
      uVar14 = 0;
      do {
        sprintf(Gia_ObjGetDumpName::pBuffer,"%c%0*d%c",0x6e,(ulong)uVar11,
                (ulong)(uint)vObjs->pArray[uVar14],0x6e);
        fprintf(__s,"  buf( %s,",Gia_ObjGetDumpName::pBuffer);
        fprintf(__s," t_%d );\n",uVar14 & 0xffffffff);
        uVar14 = uVar14 + 1;
      } while ((long)uVar14 < (long)vObjs->nSize);
    }
    fputc(10,__s);
  }
  pVVar6 = p->vCis;
  uVar14 = (ulong)(uint)pVVar6->nSize;
  if (p->nRegs < pVVar6->nSize) {
    lVar13 = 0;
    do {
      if ((int)uVar14 <= lVar13) goto LAB_0021c17b;
      uVar8 = pVVar6->pArray[lVar13];
      if (((int)uVar8 < 0) || (p->nObjs <= (int)uVar8)) goto LAB_0021c11e;
      pGVar1 = p->pObjs;
      if (pGVar1 == (Gia_Obj_t *)0x0) break;
      if (vObjs_01->nSize <= (int)uVar8) goto LAB_0021c13d;
      pGVar7 = pGVar1;
      if (((uint)vObjs_01->pArray[uVar8 >> 5] >> (uVar8 & 0x1f) & 1) != 0) {
        sprintf(Gia_ObjGetDumpName::pBuffer,"%c%0*d%c",0x6e,(ulong)uVar11,(ulong)uVar8,0x6e);
        fprintf(__s,"  buf( %s,",Gia_ObjGetDumpName::pBuffer);
        Gia_ObjGetDumpName(p->vNamesIn,'x',(int)lVar13,uVar3);
        fprintf(__s," %s );\n",Gia_ObjGetDumpName::pBuffer);
        pGVar7 = p->pObjs;
      }
      pGVar1 = pGVar1 + uVar8;
      if ((pGVar1 < pGVar7) || (pGVar7 + p->nObjs <= pGVar1)) goto LAB_0021c15c;
      uVar14 = ((long)pGVar1 - (long)pGVar7 >> 2) * -0x5555555555555555;
      uVar8 = (uint)uVar14;
      if (((int)uVar8 < 0) || (vObjs_00->nSize <= (int)uVar8)) goto LAB_0021c13d;
      if ((*(uint *)((long)vObjs_00->pArray + (ulong)((uint)(uVar14 >> 3) & 0xffffffc)) >>
           (uVar8 & 0x1f) & 1) != 0) {
        sprintf(Gia_ObjGetDumpName::pBuffer,"%c%0*d%c",0x69,(ulong)uVar11,uVar14,0x69);
        fprintf(__s,"  not( %s,",Gia_ObjGetDumpName::pBuffer);
        Gia_ObjGetDumpName(p->vNamesIn,'x',(int)lVar13,uVar3);
        fprintf(__s," %s );\n",Gia_ObjGetDumpName::pBuffer);
      }
      lVar13 = lVar13 + 1;
      pVVar6 = p->vCis;
      uVar14 = (ulong)pVVar6->nSize;
    } while (lVar13 < (long)(uVar14 - (long)p->nRegs));
  }
  fputc(10,__s);
  if (0 < p->nObjs) {
    uVar14 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar1 = p->pObjs + uVar14;
      if ((~*(uint *)pGVar1 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar1) {
        uVar3 = (uint)uVar14;
        if ((vObjs != (Vec_Int_t *)0x0) && (0 < (long)vObjs->nSize)) {
          lVar13 = 0;
          do {
            if (uVar14 == (uint)vObjs->pArray[lVar13]) goto LAB_0021be47;
            lVar13 = lVar13 + 1;
          } while (vObjs->nSize != lVar13);
        }
        sprintf(Gia_ObjGetDumpName::pBuffer,"%c%0*d%c",0x6e,(ulong)uVar11,uVar14 & 0xffffffff,0x6e);
        fprintf(__s,"  and( %s,",Gia_ObjGetDumpName::pBuffer);
        uVar8 = (uint)((*(uint *)pGVar1 >> 0x1d & 1) == 0) * 5 + 0x69;
        sprintf(Gia_ObjGetDumpName::pBuffer,"%c%0*d%c",(ulong)uVar8,(ulong)uVar11,
                (ulong)(uVar3 - (*(uint *)pGVar1 & 0x1fffffff)),(ulong)uVar8);
        fprintf(__s," %s,",Gia_ObjGetDumpName::pBuffer);
        uVar8 = (uint)((*(ulong *)pGVar1 >> 0x3d & 1) == 0) * 5 + 0x69;
        sprintf(Gia_ObjGetDumpName::pBuffer,"%c%0*d%c",(ulong)uVar8,(ulong)uVar11,
                (ulong)(uVar3 - ((uint)(*(ulong *)pGVar1 >> 0x20) & 0x1fffffff)),(ulong)uVar8);
        fprintf(__s," %s );\n",Gia_ObjGetDumpName::pBuffer);
LAB_0021be47:
        if ((long)vObjs_00->nSize <= (long)uVar14) {
LAB_0021c13d:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                        ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
        }
        if (((uint)vObjs_00->pArray[uVar14 >> 5 & 0x7ffffff] >> (uVar3 & 0x1f) & 1) != 0) {
          sprintf(Gia_ObjGetDumpName::pBuffer,"%c%0*d%c",0x69,(ulong)uVar11,uVar14 & 0xffffffff,0x69
                 );
          fprintf(__s,"  not( %s,",Gia_ObjGetDumpName::pBuffer);
          sprintf(Gia_ObjGetDumpName::pBuffer,"%c%0*d%c",0x6e,(ulong)uVar11,uVar14 & 0xffffffff,0x6e
                 );
          fprintf(__s," %s );\n",Gia_ObjGetDumpName::pBuffer);
        }
      }
      uVar14 = uVar14 + 1;
    } while ((long)uVar14 < (long)p->nObjs);
  }
  fputc(10,__s);
  pVVar6 = p->vCos;
  uVar3 = pVVar6->nSize;
  uVar14 = (ulong)uVar3;
  uVar8 = uVar3 - p->nRegs;
  if (1 < uVar8) {
    uVar12 = uVar8 - 1;
    uVar8 = 0;
    do {
      uVar8 = uVar8 + 1;
      bVar2 = 9 < uVar12;
      uVar12 = uVar12 / 10;
    } while (bVar2);
  }
  if (p->nRegs < (int)uVar3) {
    lVar13 = 0;
    do {
      if ((int)uVar14 <= lVar13) {
LAB_0021c17b:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar9 = pVVar6->pArray[lVar13];
      if (((long)iVar9 < 0) || (p->nObjs <= iVar9)) {
LAB_0021c11e:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar1 = p->pObjs + iVar9;
      Gia_ObjGetDumpName(p->vNamesOut,'z',(int)lVar13,uVar8);
      fprintf(__s,"  buf( %s, ",Gia_ObjGetDumpName::pBuffer);
      uVar12 = (uint)*(ulong *)pGVar1;
      uVar3 = uVar12 & 0x1fffffff;
      if ((~*(ulong *)(pGVar1 + -(ulong)uVar3) & 0x1fffffff1fffffff) == 0) {
        fprintf(__s,"1\'b%d );\n",(ulong)((uint)(*(ulong *)pGVar1 >> 0x1d) & 1));
      }
      else {
        pGVar7 = p->pObjs;
        if ((pGVar1 < pGVar7) || (pGVar7 + p->nObjs <= pGVar1)) {
LAB_0021c15c:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        uVar12 = (uint)((uVar12 >> 0x1d & 1) == 0) * 5 + 0x69;
        sprintf(Gia_ObjGetDumpName::pBuffer,"%c%0*d%c",(ulong)uVar12,(ulong)uVar11,
                (ulong)((int)((ulong)((long)pGVar1 - (long)pGVar7) >> 2) * -0x55555555 - uVar3),
                (ulong)uVar12);
        fprintf(__s,"%s );\n",Gia_ObjGetDumpName::pBuffer);
      }
      lVar13 = lVar13 + 1;
      pVVar6 = p->vCos;
      uVar14 = (ulong)pVVar6->nSize;
    } while (lVar13 < (long)(uVar14 - (long)p->nRegs));
  }
  fwrite("\nendmodule\n\n",0xc,1,__s);
  fclose(__s);
  if (vObjs_00->pArray != (int *)0x0) {
    free(vObjs_00->pArray);
  }
  free(vObjs_00);
  if (vObjs_01->pArray != (int *)0x0) {
    free(vObjs_01->pArray);
  }
  free(vObjs_01);
  return;
}

Assistant:

void Gia_ManDumpVerilog( Gia_Man_t * p, char * pFileName, Vec_Int_t * vObjs )
{
    FILE * pFile;
    Gia_Obj_t * pObj;
    Vec_Bit_t * vInvs, * vUsed;
    int nDigits = Abc_Base10Log( Gia_ManObjNum(p) );
    int nDigits2 = Abc_Base10Log( Gia_ManPiNum(p) );
    int i, k, iObj;
    if ( Gia_ManRegNum(p) )
    {
        printf( "Currently cannot write sequential AIG.\n" );
        return;
    }
    pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open output file \"%s\".\n", pFileName );
        return;
    }

    vInvs = Gia_ManGenUsed( p, 0 );
    vUsed = Gia_ManGenUsed( p, 1 );

    //fprintf( pFile, "// This Verilog file is written by ABC on %s\n\n", Extra_TimeStamp() );

    fprintf( pFile, "module " );
    for ( i = 0; i < (int)strlen(p->pName); i++ )
        if ( isalpha(p->pName[i]) || isdigit(p->pName[i]) )
            fprintf( pFile, "%c", p->pName[i] );
        else
            fprintf( pFile, "_" );
    fprintf( pFile, " (\n    " );
    Gia_ManWriteNames( pFile, 'x', Gia_ManPiNum(p), p->vNamesIn, 4, 4, NULL );
    fprintf( pFile, ",\n    " );

    Gia_ManWriteNames( pFile, 'z', Gia_ManPoNum(p), p->vNamesOut, 4, 4, NULL );
    fprintf( pFile, "\n  );\n\n" );

    fprintf( pFile, "  input " );
    Gia_ManWriteNames( pFile, 'x', Gia_ManPiNum(p), p->vNamesIn, 8, 4, NULL );
    fprintf( pFile, ";\n\n" );

    fprintf( pFile, "  output " );
    Gia_ManWriteNames( pFile, 'z', Gia_ManPoNum(p), p->vNamesOut, 9, 4, NULL );
    fprintf( pFile, ";\n\n" );

    if ( Vec_BitCount(vUsed) )
    {
        fprintf( pFile, "  wire " );
        Gia_ManWriteNames( pFile, 'n', Gia_ManObjNum(p), NULL, 7, 4, vUsed );
        fprintf( pFile, ";\n\n" );
    }

    if ( Vec_BitCount(vInvs) )
    {
        fprintf( pFile, "  wire " );
        Gia_ManWriteNames( pFile, 'i', Gia_ManObjNum(p), NULL, 7, 4, vInvs );
        fprintf( pFile, ";\n\n" );
    }

    if ( vObjs )
    {
        fprintf( pFile, "  wire " );
        Vec_IntForEachEntry( vObjs, iObj, i )
            fprintf( pFile, " t_%d%s", i, i==Vec_IntSize(vObjs)-1 ? "" : "," ); 
        fprintf( pFile, ";\n\n" );
        Vec_IntForEachEntry( vObjs, iObj, i )
        {
            fprintf( pFile, "  buf( %s,", Gia_ObjGetDumpName(NULL, 'n', iObj, nDigits) );
            fprintf( pFile, " t_%d );\n", i );
        }
        fprintf( pFile, "\n" );
    }

    // input inverters
    Gia_ManForEachPi( p, pObj, i )
    {
        if ( Vec_BitEntry(vUsed, Gia_ObjId(p, pObj)) )
        {
            fprintf( pFile, "  buf( %s,", Gia_ObjGetDumpName(NULL, 'n', Gia_ObjId(p, pObj), nDigits) );
            fprintf( pFile, " %s );\n",   Gia_ObjGetDumpName(p->vNamesIn, 'x', i, nDigits2) );
        }
        if ( Vec_BitEntry(vInvs, Gia_ObjId(p, pObj)) )
        {
            fprintf( pFile, "  not( %s,", Gia_ObjGetDumpName(NULL, 'i', Gia_ObjId(p, pObj), nDigits) );
            fprintf( pFile, " %s );\n",   Gia_ObjGetDumpName(p->vNamesIn, 'x', i, nDigits2) );
        }
    }

    // internal nodes and their inverters
    fprintf( pFile, "\n" );
    Gia_ManForEachAnd( p, pObj, i )
    {
        int fSkip = 0;
        if ( vObjs )
        {
            Vec_IntForEachEntry( vObjs, iObj, k )
                if ( iObj == i )
                    break;
            if ( k < Vec_IntSize(vObjs) )
                fSkip = 1;
        }
        if ( !fSkip )
        {
            fprintf( pFile, "  and( %s,", Gia_ObjGetDumpName(NULL, 'n', i, nDigits) );
            fprintf( pFile, " %s,",       Gia_ObjGetDumpName(NULL, (char)(Gia_ObjFaninC0(pObj)? 'i':'n'), Gia_ObjFaninId0(pObj, i), nDigits) );
            fprintf( pFile, " %s );\n",   Gia_ObjGetDumpName(NULL, (char)(Gia_ObjFaninC1(pObj)? 'i':'n'), Gia_ObjFaninId1(pObj, i), nDigits) );
        }
        if ( Vec_BitEntry(vInvs, i) )
        {
            fprintf( pFile, "  not( %s,", Gia_ObjGetDumpName(NULL, 'i', i, nDigits) );
            fprintf( pFile, " %s );\n",   Gia_ObjGetDumpName(NULL, 'n', i, nDigits) );
        }
    }
    
    // output drivers
    fprintf( pFile, "\n" );
    nDigits2 = Abc_Base10Log( Gia_ManPoNum(p) );
    Gia_ManForEachPo( p, pObj, i )
    {
/*
        fprintf( pFile, "  assign %s = ", Gia_ObjGetDumpName(p->vNamesOut, 'z', i, nDigits2) );
        if ( Gia_ObjIsConst0(Gia_ObjFanin0(pObj)) )
            fprintf( pFile, "1\'b%d;\n", Gia_ObjFaninC0(pObj) );
        else 
            fprintf( pFile, "%s;\n", Gia_ObjGetDumpName(NULL, (char)(Gia_ObjFaninC0(pObj)? 'i':'n'), Gia_ObjFaninId0p(p, pObj), nDigits) );
*/
        fprintf( pFile, "  buf( %s, ", Gia_ObjGetDumpName(p->vNamesOut, 'z', i, nDigits2) );
        if ( Gia_ObjIsConst0(Gia_ObjFanin0(pObj)) )
            fprintf( pFile, "1\'b%d );\n", Gia_ObjFaninC0(pObj) );
        else 
            fprintf( pFile, "%s );\n", Gia_ObjGetDumpName(NULL, (char)(Gia_ObjFaninC0(pObj)? 'i':'n'), Gia_ObjFaninId0p(p, pObj), nDigits) );
    }

    fprintf( pFile, "\nendmodule\n\n" );
    fclose( pFile );

    Vec_BitFree( vInvs );
    Vec_BitFree( vUsed );
}